

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  OwnPromiseNode extraout_RAX;
  PromiseNode *extraout_RAX_00;
  _func_int **in_RCX;
  _func_int **pp_Var5;
  TransformPromiseNodeBase *this;
  _func_int **elementCount;
  Promise<unsigned_long> promise;
  Array<char> buffer;
  OwnPromiseNode local_b8;
  AsyncInputStream *local_b0;
  PromiseArena *local_a8;
  OwnPromiseNode local_a0;
  PromiseArena *local_98;
  _func_int **pp_Stack_90;
  undefined8 *local_88;
  PromiseNode *local_80;
  PromiseArena *pPStack_78;
  _func_int **local_70;
  PromiseArena *local_68;
  _func_int **pp_Stack_60;
  undefined8 *local_58;
  OwnPromiseNode local_50;
  undefined1 local_48 [24];
  
  local_a8 = (PromiseArena *)expected.content.size_;
  pp_Var5 = (_func_int **)expected.content.ptr;
  elementCount = (_func_int **)((long)in_RCX - 1);
  if (elementCount == (_func_int **)0x0) {
    kj::_::readyNow();
    in->_vptr_AsyncInputStream = (_func_int **)local_80;
    local_50.ptr = local_80;
  }
  else {
    local_b0 = in;
    pPVar3 = (PromiseArena *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    local_88 = &kj::_::HeapArrayDisposer::instance;
    local_98 = pPVar3;
    pp_Stack_90 = elementCount;
    (**(code **)(*pp_Var5 + 8))(&local_b8,pp_Var5,pPVar3,1,elementCount);
    OVar2.ptr = local_b8.ptr;
    pPStack_78 = local_a8;
    local_58 = &kj::_::HeapArrayDisposer::instance;
    local_98 = (PromiseArena *)0x0;
    pp_Stack_90 = (_func_int **)0x0;
    pPVar1 = ((local_b8.ptr)->super_PromiseArenaMember).arena;
    local_80 = (PromiseNode *)pp_Var5;
    local_70 = in_RCX;
    local_68 = pPVar3;
    pp_Stack_60 = elementCount;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_b8.ptr - (long)pPVar1) < 0x50) {
      pvVar4 = operator_new(0x400);
      this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3b0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_b8,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1197:23)>
                 ::anon_class_48_3_6fe2814c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3b0) = &PTR_destroy_006194e0;
      *(PromiseNode **)((long)pvVar4 + 0x3d0) = local_80;
      *(PromiseArena **)((long)pvVar4 + 0x3d8) = pPStack_78;
      *(_func_int ***)((long)pvVar4 + 0x3e0) = local_70;
      *(PromiseArena **)((long)pvVar4 + 1000) = pPVar3;
      *(_func_int ***)((long)pvVar4 + 0x3f0) = elementCount;
      *(undefined8 **)((long)pvVar4 + 0x3f8) = &kj::_::HeapArrayDisposer::instance;
      *(void **)((long)pvVar4 + 0x3b8) = pvVar4;
    }
    else {
      ((local_b8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this = (TransformPromiseNodeBase *)(local_b8.ptr + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_b8,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1197:23)>
                 ::anon_class_48_3_6fe2814c_for_func::operator());
      OVar2.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006194e0;
      OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)local_80;
      OVar2.ptr[-3].super_PromiseArenaMember.arena = pPStack_78;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = local_70;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = pPVar3;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = elementCount;
      OVar2.ptr[-1].super_PromiseArenaMember.arena =
           (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
      OVar2.ptr[-5].super_PromiseArenaMember.arena = pPVar1;
    }
    pp_Stack_60 = (_func_int **)0x0;
    local_68 = (PromiseArena *)0x0;
    local_48._0_8_ = &DAT_0048a171;
    local_48._8_8_ = &DAT_0048a1d0;
    local_48._16_8_ = &DAT_4c0000058b;
    local_a0.ptr = &this->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,&local_a0,(SourceLocation *)local_48);
    OVar2.ptr = local_a0.ptr;
    local_b0->_vptr_AsyncInputStream = (_func_int **)local_50.ptr;
    if ((TransformPromiseNodeBase *)local_a0.ptr != (TransformPromiseNodeBase *)0x0) {
      local_a0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_50.ptr = extraout_RAX.ptr;
    }
    OVar2.ptr = local_b8.ptr;
    if (&(local_b8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_b8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_50.ptr = extraout_RAX_00;
    }
  }
  return (Promise<void>)local_50.ptr;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then([&in,expected,buffer=kj::mv(buffer)](size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.first(amount);
    if (actual != expected.asBytes().first(amount)) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  });
}